

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btMultiBodyJointMotor.cpp
# Opt level: O0

void __thiscall
btMultiBodyJointMotor::createConstraintRows
          (btMultiBodyJointMotor *this,btMultiBodyConstraintArray *constraintRows,
          btMultiBodyJacobianData *data,btContactSolverInfo *infoGlobal)

{
  int iVar1;
  btMultiBodySolverConstraint *pbVar2;
  btVector3 *v;
  btMultibodyLink *pbVar3;
  btMultiBodyConstraint *in_RDI;
  btVector3 bVar4;
  btVector3 prismaticAxisInWorld;
  btVector3 revoluteAxisInWorld;
  btMultiBodySolverConstraint *constraintRow;
  int row;
  btVector3 dummy;
  btScalar posError;
  btScalar in_stack_000002ec;
  btScalar in_stack_000002f0;
  undefined1 in_stack_000002f7;
  btScalar in_stack_000002f8;
  btScalar in_stack_000002fc;
  btScalar in_stack_00000300;
  btScalar in_stack_00000304;
  btVector3 *in_stack_00000308;
  btScalar *in_stack_00000310;
  btScalar *in_stack_00000318;
  btMultiBodyJacobianData *in_stack_00000320;
  btMultiBodySolverConstraint *in_stack_00000328;
  btMultiBodyConstraint *in_stack_00000330;
  btVector3 *in_stack_00000340;
  btVector3 *in_stack_00000348;
  btContactSolverInfo *in_stack_00000350;
  btMultiBody *in_stack_ffffffffffffff08;
  int row_00;
  btMultiBody *in_stack_ffffffffffffff10;
  eFeatherstoneJointType eVar5;
  int iVar6;
  int local_44;
  btScalar local_40;
  btScalar local_3c;
  btScalar local_38;
  undefined4 local_24;
  
  if (in_RDI->m_numDofsFinalized != in_RDI->m_jacSizeBoth) {
    (*in_RDI->_vptr_btMultiBodyConstraint[2])();
  }
  if (in_RDI->m_numDofsFinalized == in_RDI->m_jacSizeBoth) {
    local_24 = 0;
    local_38 = 0.0;
    local_3c = 0.0;
    local_40 = 0.0;
    btVector3::btVector3((btVector3 *)&stack0xffffffffffffffcc,&local_38,&local_3c,&local_40);
    local_44 = 0;
    while( true ) {
      row_00 = (int)((ulong)in_stack_ffffffffffffff08 >> 0x20);
      iVar6 = local_44;
      iVar1 = btMultiBodyConstraint::getNumRows(in_RDI);
      if (iVar1 <= iVar6) break;
      pbVar2 = btAlignedObjectArray<btMultiBodySolverConstraint>::expandNonInitializing
                         ((btAlignedObjectArray<btMultiBodySolverConstraint> *)
                          in_stack_ffffffffffffff10);
      v = (btVector3 *)
          btMultiBodyConstraint::jacobianA
                    ((btMultiBodyConstraint *)in_stack_ffffffffffffff10,row_00);
      btMultiBodyConstraint::jacobianB((btMultiBodyConstraint *)in_stack_ffffffffffffff10,row_00);
      in_stack_ffffffffffffff08 = (btMultiBody *)&stack0xffffffffffffffcc;
      in_stack_ffffffffffffff10 = in_stack_ffffffffffffff08;
      btMultiBodyConstraint::fillMultiBodyConstraint
                (in_stack_00000330,in_stack_00000328,in_stack_00000320,in_stack_00000318,
                 in_stack_00000310,in_stack_00000308,in_stack_00000340,in_stack_00000348,
                 in_stack_00000304,in_stack_00000350,in_stack_00000300,in_stack_000002fc,
                 in_stack_000002f8,(bool)in_stack_000002f7,in_stack_000002f0,in_stack_000002ec);
      pbVar2->m_orgConstraint = in_RDI;
      pbVar2->m_orgDofIndex = local_44;
      pbVar3 = btMultiBody::getLink
                         (in_stack_ffffffffffffff10,(int)((ulong)in_stack_ffffffffffffff08 >> 0x20))
      ;
      eVar5 = pbVar3->m_jointType;
      if (eVar5 == eRevolute) {
        btVector3::setZero((btVector3 *)in_stack_ffffffffffffff10);
        btVector3::setZero((btVector3 *)in_stack_ffffffffffffff10);
        btMultiBody::getLink
                  (in_stack_ffffffffffffff10,(int)((ulong)in_stack_ffffffffffffff08 >> 0x20));
        btTransform::getRotation((btTransform *)in_stack_ffffffffffffff10);
        btMultiBody::getLink
                  (in_stack_ffffffffffffff10,(int)((ulong)in_stack_ffffffffffffff08 >> 0x20));
        bVar4 = quatRotate((btQuaternion *)CONCAT44(iVar6,eVar5),v);
        *(long *)(pbVar2->m_relpos1CrossNormal).m_floats = bVar4.m_floats._0_8_;
        *(long *)((pbVar2->m_relpos1CrossNormal).m_floats + 2) = bVar4.m_floats._8_8_;
        bVar4 = operator-((btVector3 *)in_stack_ffffffffffffff10);
        *(long *)(pbVar2->m_relpos2CrossNormal).m_floats = bVar4.m_floats._0_8_;
        *(long *)((pbVar2->m_relpos2CrossNormal).m_floats + 2) = bVar4.m_floats._8_8_;
      }
      else if (eVar5 == ePrismatic) {
        btMultiBody::getLink
                  (in_stack_ffffffffffffff10,(int)((ulong)in_stack_ffffffffffffff08 >> 0x20));
        btTransform::getRotation((btTransform *)in_stack_ffffffffffffff10);
        btMultiBody::getLink
                  (in_stack_ffffffffffffff10,(int)((ulong)in_stack_ffffffffffffff08 >> 0x20));
        bVar4 = quatRotate((btQuaternion *)CONCAT44(iVar6,eVar5),v);
        *(long *)(pbVar2->m_contactNormal1).m_floats = bVar4.m_floats._0_8_;
        *(long *)((pbVar2->m_contactNormal1).m_floats + 2) = bVar4.m_floats._8_8_;
        bVar4 = operator-((btVector3 *)in_stack_ffffffffffffff10);
        *(long *)(pbVar2->m_contactNormal2).m_floats = bVar4.m_floats._0_8_;
        *(long *)((pbVar2->m_contactNormal2).m_floats + 2) = bVar4.m_floats._8_8_;
        btVector3::setZero((btVector3 *)in_stack_ffffffffffffff10);
        btVector3::setZero((btVector3 *)in_stack_ffffffffffffff10);
      }
      local_44 = local_44 + 1;
    }
  }
  return;
}

Assistant:

void btMultiBodyJointMotor::createConstraintRows(btMultiBodyConstraintArray& constraintRows,
		btMultiBodyJacobianData& data,
		const btContactSolverInfo& infoGlobal)
{
    // only positions need to be updated -- data.m_jacobians and force
    // directions were set in the ctor and never change.
	
	if (m_numDofsFinalized != m_jacSizeBoth)
	{
        finalizeMultiDof();
	}

	//don't crash
	if (m_numDofsFinalized != m_jacSizeBoth)
		return;

	const btScalar posError = 0;
	const btVector3 dummy(0, 0, 0);

	for (int row=0;row<getNumRows();row++)
	{
		btMultiBodySolverConstraint& constraintRow = constraintRows.expandNonInitializing();


		fillMultiBodyConstraint(constraintRow,data,jacobianA(row),jacobianB(row),dummy,dummy,dummy,posError,infoGlobal,-m_maxAppliedImpulse,m_maxAppliedImpulse,1,false,m_desiredVelocity);
		constraintRow.m_orgConstraint = this;
		constraintRow.m_orgDofIndex = row;
		{
			//expect either prismatic or revolute joint type for now
			btAssert((m_bodyA->getLink(m_linkA).m_jointType == btMultibodyLink::eRevolute)||(m_bodyA->getLink(m_linkA).m_jointType == btMultibodyLink::ePrismatic));
			switch (m_bodyA->getLink(m_linkA).m_jointType)
			{
				case btMultibodyLink::eRevolute:
				{
					constraintRow.m_contactNormal1.setZero();
					constraintRow.m_contactNormal2.setZero();
					btVector3 revoluteAxisInWorld = quatRotate(m_bodyA->getLink(m_linkA).m_cachedWorldTransform.getRotation(),m_bodyA->getLink(m_linkA).m_axes[0].m_topVec);
					constraintRow.m_relpos1CrossNormal=revoluteAxisInWorld;
					constraintRow.m_relpos2CrossNormal=-revoluteAxisInWorld;
					
					break;
				}
				case btMultibodyLink::ePrismatic:
				{
					btVector3 prismaticAxisInWorld = quatRotate(m_bodyA->getLink(m_linkA).m_cachedWorldTransform.getRotation(),m_bodyA->getLink(m_linkA).m_axes[0].m_bottomVec);
					constraintRow.m_contactNormal1=prismaticAxisInWorld;
					constraintRow.m_contactNormal2=-prismaticAxisInWorld;
					constraintRow.m_relpos1CrossNormal.setZero();
					constraintRow.m_relpos2CrossNormal.setZero();
					
					break;
				}
				default:
				{
					btAssert(0);
				}
			};
			
		}

	}

}